

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multitexturedmesh.cc
# Opt level: O2

void __thiscall gvr::MultiTexturedMesh::resizeTriangleList(MultiTexturedMesh *this,int tn)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  UVT *pUVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  UVT *pUVar9;
  long lVar10;
  ulong uVar11;
  
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)tn;
  uVar11 = 0xffffffffffffffff;
  if (SUB168(auVar5 * ZEXT816(0x1c),8) == 0) {
    uVar11 = SUB168(auVar5 * ZEXT816(0x1c),0);
  }
  pUVar9 = (UVT *)operator_new__(uVar11);
  uVar3 = (this->super_Mesh).n;
  uVar11 = (ulong)uVar3;
  if (tn <= (int)uVar3) {
    uVar11 = (ulong)(uint)tn;
  }
  pUVar4 = this->uvt;
  lVar10 = uVar11 * 0x1c;
  while( true ) {
    if ((int)uVar11 < 1) break;
    puVar1 = (undefined8 *)((long)pUVar4[-1].uv + lVar10);
    uVar6 = *puVar1;
    uVar7 = puVar1[1];
    puVar1 = (undefined8 *)((long)pUVar4[-1].uv + lVar10 + 0xc);
    uVar8 = puVar1[1];
    puVar2 = (undefined8 *)((long)pUVar9[-1].uv + lVar10 + 0xc);
    *puVar2 = *puVar1;
    puVar2[1] = uVar8;
    puVar1 = (undefined8 *)((long)pUVar9[-1].uv + lVar10);
    *puVar1 = uVar6;
    puVar1[1] = uVar7;
    uVar11 = (ulong)((int)uVar11 - 1);
    lVar10 = lVar10 + -0x1c;
  }
  if (pUVar4 != (UVT *)0x0) {
    operator_delete__(pUVar4);
  }
  this->uvt = pUVar9;
  Mesh::resizeTriangleList(&this->super_Mesh,tn);
  return;
}

Assistant:

void MultiTexturedMesh::resizeTriangleList(int tn)
{
  UVT *p=new UVT [tn];

  for (int i=std::min(getTriangleCount(), tn)-1; i>=0; i--)
  {
    p[i]=uvt[i];
  }

  delete [] uvt;

  uvt=p;

  Mesh::resizeTriangleList(tn);
}